

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::
emplace<std::pair<QByteArray,QByteArray>>
          (QMovableArrayOps<std::pair<QByteArray,QByteArray>> *this,qsizetype i,
          pair<QByteArray,_QByteArray> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  long lVar9;
  long lVar10;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar10 = *(long *)(this + 0x10);
    if ((lVar10 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) - lVar10 !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      lVar9 = *(long *)(this + 8);
      lVar10 = lVar10 * 0x30;
      pDVar3 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar9 + lVar10) = pDVar3;
      pcVar4 = (args->first).d.ptr;
      (args->first).d.ptr = (char *)0x0;
      *(char **)(lVar9 + 8 + lVar10) = pcVar4;
      qVar5 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar9 + 0x10 + lVar10) = qVar5;
      pDVar3 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(lVar9 + 0x18 + lVar10) = pDVar3;
      pcVar4 = (args->second).d.ptr;
      (args->second).d.ptr = (char *)0x0;
      *(char **)(lVar9 + 0x20 + lVar10) = pcVar4;
      qVar5 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(lVar9 + 0x28 + lVar10) = qVar5;
      goto LAB_00193897;
    }
    if (((i == 0) && (piVar2 != (int *)0x0)) &&
       (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      lVar10 = *(long *)(this + 8);
      pDVar3 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar10 + -0x30) = pDVar3;
      pcVar4 = (args->first).d.ptr;
      (args->first).d.ptr = (char *)0x0;
      *(char **)(lVar10 + -0x28) = pcVar4;
      qVar5 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar10 + -0x20) = qVar5;
      pDVar3 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(lVar10 + -0x18) = pDVar3;
      pcVar4 = (args->second).d.ptr;
      (args->second).d.ptr = (char *)0x0;
      *(char **)(lVar10 + -0x10) = pcVar4;
      qVar5 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(lVar10 + -8) = qVar5;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
      goto LAB_00193897;
    }
  }
  pDVar3 = (args->first).d.d;
  pcVar4 = (args->first).d.ptr;
  (args->first).d.d = (Data *)0x0;
  (args->first).d.ptr = (char *)0x0;
  qVar5 = (args->first).d.size;
  pDVar6 = (args->second).d.d;
  (args->first).d.size = 0;
  (args->second).d.d = (Data *)0x0;
  pcVar7 = (args->second).d.ptr;
  qVar8 = (args->second).d.size;
  (args->second).d.ptr = (char *)0x0;
  (args->second).d.size = 0;
  lVar10 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,
             (uint)(i == 0 && lVar10 != 0),1,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  lVar9 = *(long *)(this + 8);
  if (i == 0 && lVar10 != 0) {
    *(Data **)(lVar9 + -0x30) = pDVar3;
    *(char **)(lVar9 + -0x28) = pcVar4;
    *(qsizetype *)(lVar9 + -0x20) = qVar5;
    *(Data **)(lVar9 + -0x18) = pDVar6;
    *(char **)(lVar9 + -0x10) = pcVar7;
    *(qsizetype *)(lVar9 + -8) = qVar8;
    *(long *)(this + 8) = lVar9 + -0x30;
  }
  else {
    puVar1 = (undefined8 *)(lVar9 + i * 0x30);
    memmove(puVar1 + 6,(void *)(lVar9 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
    *puVar1 = pDVar3;
    puVar1[1] = pcVar4;
    puVar1[2] = qVar5;
    puVar1[3] = pDVar6;
    puVar1[4] = pcVar7;
    puVar1[5] = qVar8;
  }
LAB_00193897:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }